

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O1

int cmGccDepfile_yylex_destroy(yyscan_t yyscanner)

{
  YY_BUFFER_STATE b;
  yyguts_t *yyg;
  void *__ptr;
  
  __ptr = *(void **)((long)yyscanner + 0x28);
  while ((__ptr != (void *)0x0 &&
         (b = *(YY_BUFFER_STATE *)((long)__ptr + *(long *)((long)yyscanner + 0x18) * 8),
         b != (YY_BUFFER_STATE)0x0))) {
    cmGccDepfile_yy_delete_buffer(b,yyscanner);
    *(undefined8 *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) = 0;
    cmGccDepfile_yypop_buffer_state(yyscanner);
    __ptr = *(void **)((long)yyscanner + 0x28);
  }
  free(__ptr);
  *(undefined8 *)((long)yyscanner + 0x28) = 0;
  free(*(void **)((long)yyscanner + 0x60));
  *(undefined8 *)((long)yyscanner + 0x60) = 0;
  *(undefined8 *)((long)yyscanner + 0x54) = 0;
  *(undefined8 *)((long)yyscanner + 8) = 0;
  *(undefined8 *)((long)yyscanner + 0x10) = 0;
  *(undefined8 *)((long)yyscanner + 0x18) = 0;
  *(undefined8 *)((long)yyscanner + 0x20) = 0;
  *(undefined8 *)((long)yyscanner + 0x28) = 0;
  *(undefined8 *)((long)yyscanner + 0x40) = 0;
  *(undefined8 *)((long)yyscanner + 0x48) = 0;
  free(yyscanner);
  return 0;
}

Assistant:

int yylex_destroy  (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

    /* Pop the buffer stack, destroying each element. */
	while(YY_CURRENT_BUFFER){
		yy_delete_buffer( YY_CURRENT_BUFFER , yyscanner );
		YY_CURRENT_BUFFER_LVALUE = NULL;
		yypop_buffer_state(yyscanner);
	}

	/* Destroy the stack itself. */
	yyfree(yyg->yy_buffer_stack , yyscanner);
	yyg->yy_buffer_stack = NULL;

    /* Destroy the start condition stack. */
        yyfree( yyg->yy_start_stack , yyscanner );
        yyg->yy_start_stack = NULL;

    /* Reset the globals. This is important in a non-reentrant scanner so the next time
     * yylex() is called, initialization will occur. */
    yy_init_globals( yyscanner);

    /* Destroy the main struct (reentrant only). */
    yyfree ( yyscanner , yyscanner );
    yyscanner = NULL;
    return 0;
}